

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetPortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetPortHeaderSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,DataTypeSyntax *args_2)

{
  Token direction;
  Token netType;
  NetPortHeaderSyntax *this_00;
  
  this_00 = (NetPortHeaderSyntax *)allocate(this,0x38,8);
  direction.kind = args->kind;
  direction._2_1_ = args->field_0x2;
  direction.numFlags.raw = (args->numFlags).raw;
  direction.rawLen = args->rawLen;
  direction.info = args->info;
  netType.kind = args_1->kind;
  netType._2_1_ = args_1->field_0x2;
  netType.numFlags.raw = (args_1->numFlags).raw;
  netType.rawLen = args_1->rawLen;
  netType.info = args_1->info;
  slang::syntax::NetPortHeaderSyntax::NetPortHeaderSyntax(this_00,direction,netType,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }